

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void __thiscall testing::TestCase::AddTestInfo(TestCase *this,TestInfo *test_info)

{
  pointer *pppTVar1;
  iterator __position;
  iterator __position_00;
  int local_14;
  TestInfo *local_10;
  
  __position._M_current =
       (this->test_info_list_).
       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = test_info;
  if (__position._M_current ==
      (this->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>::
    _M_realloc_insert<testing::TestInfo*const&>
              ((vector<testing::TestInfo*,std::allocator<testing::TestInfo*>> *)
               &this->test_info_list_,__position,&local_10);
  }
  else {
    *__position._M_current = test_info;
    pppTVar1 = &(this->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  __position_00._M_current =
       (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_14 = (int)((ulong)((long)__position_00._M_current -
                          (long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (__position_00._M_current ==
      (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->test_indices_,__position_00,&local_14);
  }
  else {
    *__position_00._M_current = local_14;
    (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

void TestCase::AddTestInfo(TestInfo * test_info) {
  test_info_list_.push_back(test_info);
  test_indices_.push_back(static_cast<int>(test_indices_.size()));
}